

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

vec3 __thiscall vera::Camera::worldToCamera(Camera *this,vec3 *_world,mat4 *_model)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec3 vVar2;
  col_type cVar3;
  vec<3,_float,_(glm::qualifier)0> local_6c;
  undefined1 local_60 [8];
  vec4 camera;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_48;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_44;
  undefined1 local_40 [8];
  vec4 pos;
  mat4 *_model_local;
  vec3 *_world_local;
  Camera *this_local;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  
  pos._8_8_ = _model;
  glm::vec<4,float,(glm::qualifier)0>::vec<float,float,(glm::qualifier)0>
            ((vec<4,float,(glm::qualifier)0> *)local_40,_world,1.0);
  if (pos._8_8_ != 0) {
    cVar3 = glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)pos._8_8_,(row_type *)local_40);
    camera._8_8_ = cVar3._0_8_;
    local_40._0_4_ = camera.field_2;
    local_40._4_4_ = camera.field_3;
    _local_48 = cVar3._8_8_;
    pos.field_0 = local_48;
    pos.field_1 = aStack_44;
    unique0x100000c6 = cVar3;
  }
  _local_60 = glm::operator*(&this->m_projectionViewMatrix,(row_type *)local_40);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
            ((vec<3,float,(glm::qualifier)0> *)&local_6c,
             (vec<4,_float,_(glm::qualifier)0> *)local_60);
  vVar1 = glm::operator/(&local_6c,camera.field_1.y);
  vVar2.field_0 = vVar1.field_0;
  vVar2.field_1 = vVar1.field_1;
  register0x00001240 = vVar1.field_2;
  return vVar2;
}

Assistant:

glm::vec3 Camera::worldToCamera(const glm::vec3* _world, glm::mat4* _model) const {
    glm::vec4 pos = glm::vec4(*_world, 1.0f);
    if (_model != nullptr)
        pos = (*_model) * pos;
    glm::vec4 camera = m_projectionViewMatrix * pos;
    return glm::vec3(camera) / camera.w;
}